

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O2

bool __thiscall Plan::EdgeFinished(Plan *this,Edge *edge,EdgeResult result,string *err)

{
  int iVar1;
  bool bVar2;
  iterator __position;
  pointer ppNVar3;
  bool bVar4;
  Edge *local_38;
  
  local_38 = edge;
  __position = std::
               _Rb_tree<Edge_*,_std::pair<Edge_*const,_Plan::Want>,_std::_Select1st<std::pair<Edge_*const,_Plan::Want>_>,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
               ::find((_Rb_tree<Edge_*,_std::pair<Edge_*const,_Plan::Want>,_std::_Select1st<std::pair<Edge_*const,_Plan::Want>_>,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
                       *)this,&local_38);
  if ((_Rb_tree_header *)__position._M_node == &(this->want_)._M_t._M_impl.super__Rb_tree_header) {
    __assert_fail("e != want_.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build.cc",
                  0xbe,"bool Plan::EdgeFinished(Edge *, EdgeResult, string *)");
  }
  iVar1 = *(int *)&__position._M_node[1]._M_parent;
  if (iVar1 != 0) {
    Pool::EdgeFinished(local_38->pool_,local_38);
  }
  Pool::RetrieveReadyEdges(local_38->pool_,&this->ready_);
  bVar4 = true;
  if (result == kEdgeSucceeded) {
    if (iVar1 != 0) {
      this->wanted_edges_ = this->wanted_edges_ + -1;
    }
    std::
    _Rb_tree<Edge*,std::pair<Edge*const,Plan::Want>,std::_Select1st<std::pair<Edge*const,Plan::Want>>,std::less<Edge*>,std::allocator<std::pair<Edge*const,Plan::Want>>>
    ::erase_abi_cxx11_((_Rb_tree<Edge*,std::pair<Edge*const,Plan::Want>,std::_Select1st<std::pair<Edge*const,Plan::Want>>,std::less<Edge*>,std::allocator<std::pair<Edge*const,Plan::Want>>>
                        *)this,__position);
    local_38->outputs_ready_ = true;
    ppNVar3 = (local_38->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      bVar4 = ppNVar3 ==
              (local_38->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
      if (bVar4) {
        return bVar4;
      }
      bVar2 = NodeFinished(this,*ppNVar3,err);
      ppNVar3 = ppNVar3 + 1;
    } while (bVar2);
  }
  return bVar4;
}

Assistant:

bool Plan::EdgeFinished(Edge* edge, EdgeResult result, string* err) {
  map<Edge*, Want>::iterator e = want_.find(edge);
  assert(e != want_.end());
  bool directly_wanted = e->second != kWantNothing;

  // See if this job frees up any delayed jobs.
  if (directly_wanted)
    edge->pool()->EdgeFinished(*edge);
  edge->pool()->RetrieveReadyEdges(&ready_);

  // The rest of this function only applies to successful commands.
  if (result != kEdgeSucceeded)
    return true;

  if (directly_wanted)
    --wanted_edges_;
  want_.erase(e);
  edge->outputs_ready_ = true;

  // Check off any nodes we were waiting for with this edge.
  for (vector<Node*>::iterator o = edge->outputs_.begin();
       o != edge->outputs_.end(); ++o) {
    if (!NodeFinished(*o, err))
      return false;
  }
  return true;
}